

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisualElement.cpp
# Opt level: O2

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::VisualElement::childElementForName(VisualElement *this,string *name)

{
  bool bVar1;
  Transform *__args_1;
  shared_ptr<iDynTree::SolidShape> *__args_1_00;
  void **__args_1_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<iDynTree::XMLElement> sVar3;
  shared_ptr<iDynTree::MaterialElement> ptr;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  __shared_ptr<iDynTree::MaterialElement::MaterialInfo,_(__gnu_cxx::_Lock_policy)2> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  bVar1 = std::operator==(in_RDX,"origin");
  if (bVar1) {
    __args_1 = (Transform *)iDynTree::XMLElement::getParserState();
    std::make_shared<iDynTree::OriginElement,iDynTree::XMLParserState&,iDynTree::Transform&>
              ((XMLParserState *)&stack0xffffffffffffffc8,__args_1);
  }
  else {
    bVar1 = std::operator==(in_RDX,"geometry");
    if (bVar1) {
      __args_1_00 = (shared_ptr<iDynTree::SolidShape> *)iDynTree::XMLElement::getParserState();
      std::
      make_shared<iDynTree::GeometryElement,iDynTree::XMLParserState&,std::shared_ptr<iDynTree::SolidShape>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                ((XMLParserState *)&stack0xffffffffffffffc8,__args_1_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&name[4].field_2 + 8));
    }
    else {
      bVar1 = std::operator==(in_RDX,"material");
      if (!bVar1) {
        __args_1_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      iDynTree::XMLElement::getParserState();
        sVar3 = std::
                make_shared<iDynTree::XMLElement,iDynTree::XMLParserState&,std::__cxx11::string_const&>
                          ((XMLParserState *)this,__args_1_02);
        _Var2 = sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        goto LAB_00140cb8;
      }
      __args_1_01 = (void **)iDynTree::XMLElement::getParserState();
      local_28._M_ptr = (element_type *)0x0;
      std::make_shared<iDynTree::MaterialElement,iDynTree::XMLParserState&,decltype(nullptr)>
                ((XMLParserState *)&stack0xffffffffffffffc8,__args_1_01);
      MaterialElement::materialInfo((MaterialElement *)&local_28);
      std::__shared_ptr<iDynTree::MaterialElement::MaterialInfo,_(__gnu_cxx::_Lock_policy)2>::
      operator=((__shared_ptr<iDynTree::MaterialElement::MaterialInfo,_(__gnu_cxx::_Lock_policy)2> *
                )&name[5]._M_string_length,&local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    }
  }
  _Var2._M_pi = _Stack_30._M_pi;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)this = local_38;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8 = _Var2._M_pi;
  local_38 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  _Var2._M_pi = extraout_RDX;
LAB_00140cb8:
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_XMLElement;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> VisualElement::childElementForName(const std::string& name) {
        if (name == "origin") {
            return std::make_shared<OriginElement>(getParserState(), m_info.m_origin);
        } else if (name == "geometry") {
            return std::make_shared<GeometryElement>(
                getParserState(), m_info.m_solidShape, m_info.m_packageDirs);
        } else if (name == "material") {
            auto ptr = std::make_shared<MaterialElement>(getParserState(), nullptr);
            m_info.m_material = ptr->materialInfo();
            return ptr;
        }
        return std::make_shared<XMLElement>(getParserState(), name);
    }